

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O1

void expandSeeds(tree_t *tree,uint8_t *salt,uint repIndex,picnic_instance_t *params)

{
  uint uVar1;
  ulong uVar2;
  byte bVar3;
  tree_t *ptVar4;
  uint uVar5;
  ulong __n;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  uint16_t data0_le;
  uint16_t data2_le;
  uint16_t data1_le;
  uint8_t *tmp_ptr [4];
  uint8_t tmp [256];
  undefined6 in_stack_fffffffffffffaa8;
  BitSequence in_stack_fffffffffffffaae;
  undefined1 in_stack_fffffffffffffaaf;
  undefined2 local_536;
  undefined2 local_534;
  undefined2 local_532;
  ulong local_530;
  tree_t *local_528;
  ulong local_520;
  ulong local_518;
  uint8_t *local_510;
  picnic_instance_t *local_508;
  uint local_4fc;
  BitSequence *local_4f8;
  uint8_t *puStack_4f0;
  uint8_t *puStack_4e8;
  uint8_t *puStack_4e0;
  BitSequence *local_4d8;
  ulong local_4d0;
  BitSequence *local_4c8 [4];
  undefined1 local_4a8 [32];
  undefined1 local_488 [32];
  BitSequence local_468 [64];
  undefined1 local_428 [64];
  undefined1 local_3e8 [64];
  undefined1 local_3a8 [64];
  Keccak_HashInstancetimes4 local_368;
  
  bVar3 = params->seed_size;
  __n = (ulong)bVar3;
  local_4c8[0] = local_468;
  local_4c8[1] = local_428;
  local_4c8[2] = local_3e8;
  local_4c8[3] = local_3a8;
  local_518 = (ulong)((tree->numNodes >> 1) - 1);
  local_4d8 = local_468 + __n;
  uVar7 = 2;
  if (local_518 < 2) {
    uVar7 = local_518;
  }
  local_528 = (tree_t *)(uVar7 * 4 + 4);
  lVar11 = 0;
  lVar8 = 0;
  uVar12 = 0;
  uVar7 = 0;
  local_510 = salt;
  local_508 = params;
  do {
    uVar6 = uVar12;
    if ((tree->haveNodeExists[uVar7 >> 5] >> (uVar12 & 0x3f) & 2) != 0) {
      local_530 = uVar7;
      local_520 = uVar12;
      hashSeed(local_468,tree->nodes + lVar11,local_510,(uint8_t)repIndex,(uint)uVar7,
               (uint)local_508,
               (picnic_instance_t *)
               CONCAT17(in_stack_fffffffffffffaaf,
                        CONCAT16(in_stack_fffffffffffffaae,in_stack_fffffffffffffaa8)));
      uVar7 = 2L << (lVar8 + 2U & 0x3f);
      uVar12 = lVar8 + 2U >> 6;
      if ((tree->haveNodeExists[uVar12] & uVar7) == 0) {
        memcpy(tree->nodes + lVar11 * 2 + __n,local_468,__n);
        tree->haveNodeExists[uVar12] = tree->haveNodeExists[uVar12] | uVar7;
      }
      uVar7 = local_530;
      uVar12 = lVar8 + 4;
      uVar6 = local_520;
      if (((uint)(tree->haveNodeExists[uVar12 >> 6] >> (uVar12 & 0x3f)) & 3) == 1) {
        memcpy(tree->nodes + lVar11 * 2 + (ulong)((uint)bVar3 * 2),local_4d8,__n);
        tree->haveNodeExists[uVar12 >> 6] =
             tree->haveNodeExists[uVar12 >> 6] | 2L << (uVar12 & 0x3f);
        uVar6 = local_520;
      }
    }
    uVar7 = uVar7 + 1;
    uVar12 = uVar6 + 2;
    lVar8 = lVar8 + 4;
    lVar11 = lVar11 + __n;
  } while (local_528 != (tree_t *)lVar8);
  local_4fc = (uint)local_518 & 0xfffffffc;
  local_528 = tree;
  if ((uint)uVar7 <= local_4fc) {
    uVar6 = uVar6 + 4;
    local_4a8 = vpbroadcastq_avx512vl();
    local_488 = vpbroadcastq_avx512vl();
    do {
      bVar3 = local_508->seed_size;
      uVar12 = (ulong)bVar3;
      if (local_508->digest_size == ' ') {
        uVar10 = 0x540;
        uVar9 = 0x100;
      }
      else {
        uVar10 = 0x440;
        uVar9 = 0x200;
      }
      local_520 = uVar6;
      Keccak_HashInitializetimes4(&local_368,uVar10,uVar9,0,'\x1f');
      uVar6 = uVar7 & 0xffffffff;
      local_4f8 = (BitSequence *)local_4a8._0_8_;
      puStack_4f0 = (uint8_t *)local_4a8._8_8_;
      puStack_4e8 = (uint8_t *)local_4a8._16_8_;
      puStack_4e0 = (uint8_t *)local_4a8._24_8_;
      Keccak_HashUpdatetimes4(&local_368,&local_4f8,8);
      puStack_4e0 = tree->nodes;
      local_4f8 = puStack_4e0 + uVar12 * uVar6;
      uVar9 = (uint)uVar7;
      local_530 = (ulong)(uVar9 + 1);
      puStack_4f0 = puStack_4e0 + local_530 * uVar12;
      local_4d0 = (ulong)(uVar9 + 2);
      puStack_4e8 = puStack_4e0 + local_4d0 * uVar12;
      puStack_4e0 = puStack_4e0 + (uVar9 + 3) * uVar12;
      Keccak_HashUpdatetimes4(&local_368,&local_4f8,(ulong)((uint)bVar3 * 8));
      local_4f8 = (BitSequence *)local_488._0_8_;
      puStack_4f0 = (uint8_t *)local_488._8_8_;
      puStack_4e8 = (uint8_t *)local_488._16_8_;
      puStack_4e0 = (uint8_t *)local_488._24_8_;
      Keccak_HashUpdatetimes4(&local_368,&local_4f8,0x100);
      local_4f8 = (BitSequence *)local_4a8._0_8_;
      puStack_4f0 = (uint8_t *)local_4a8._8_8_;
      puStack_4e8 = (uint8_t *)local_4a8._16_8_;
      puStack_4e0 = (uint8_t *)local_4a8._24_8_;
      Keccak_HashUpdatetimes4(&local_368,&local_4f8,0x10);
      in_stack_fffffffffffffaae = (BitSequence)uVar6;
      in_stack_fffffffffffffaaf = (undefined1)(uVar6 >> 8);
      local_532 = (undefined2)local_530;
      local_534 = (undefined2)local_4d0;
      local_536 = (undefined2)(uVar9 + 3);
      local_4f8 = &stack0xfffffffffffffaae;
      puStack_4f0 = (uint8_t *)&local_532;
      puStack_4e8 = (uint8_t *)&local_534;
      puStack_4e0 = (uint8_t *)&local_536;
      Keccak_HashUpdatetimes4(&local_368,&local_4f8,0x10);
      Keccak_HashFinaltimes4(&local_368,(BitSequence **)0x0);
      Keccak_HashSqueezetimes4(&local_368,local_4c8,(ulong)bVar3 << 4);
      uVar7 = (ulong)(uVar9 + 4);
      local_530 = uVar7;
      if (uVar9 < 0xfffffffc) {
        lVar11 = 0;
        uVar12 = local_520;
        do {
          uVar9 = (int)uVar12 - 1;
          if ((tree->haveNodeExists[uVar9 >> 6] >> ((ulong)uVar9 & 0x3f) & 1) != 0) {
            uVar2 = lVar8 + 3 + lVar11;
            uVar13 = uVar2 >> 6 & 0x3ffffff;
            if ((tree->haveNodeExists[uVar13] >> (uVar2 & 0x3f) & 1) == 0) {
              memcpy(local_528->nodes + uVar9 * __n,*(void **)((long)local_4c8 + lVar11 * 2),__n);
              local_528->haveNodeExists[uVar13] =
                   local_528->haveNodeExists[uVar13] | 1L << (uVar2 & 0x3f);
              tree = local_528;
            }
            uVar2 = lVar8 + 4 + lVar11;
            if (((uint)(tree->haveNodeExists[uVar2 >> 6 & 0x3ffffff] >> (uVar2 & 0x3c)) & 3) == 1) {
              memcpy(tree->nodes + (uVar12 & 0xffffffff) * __n,
                     (void *)(*(long *)((long)local_4c8 + lVar11 * 2) + __n),__n);
              uVar9 = (int)lVar8 + 5 + (int)lVar11;
              tree->haveNodeExists[uVar9 >> 6] =
                   tree->haveNodeExists[uVar9 >> 6] | 1L << ((byte)uVar9 & 0x3d);
            }
          }
          uVar6 = uVar6 + 1;
          lVar11 = lVar11 + 4;
          uVar12 = (ulong)((int)uVar12 + 2);
        } while (uVar6 < uVar7);
      }
      lVar8 = lVar8 + 0x10;
      uVar6 = (ulong)((int)local_520 + 8);
      uVar7 = local_530;
    } while ((uint)local_530 <= local_4fc);
  }
  ptVar4 = local_528;
  uVar9 = (uint)uVar7;
  if (uVar9 <= (uint)local_518) {
    uVar10 = uVar9 * 4 + 5;
    uVar9 = uVar9 * 2;
    do {
      uVar5 = uVar9 + 1;
      if ((ptVar4->haveNodeExists[uVar5 >> 6] >> ((ulong)uVar5 & 0x3f) & 1) != 0) {
        hashSeed(local_468,ptVar4->nodes + (uVar7 & 0xffffffff) * __n,local_510,(uint8_t)repIndex,
                 (uint)uVar7,(uint)local_508,
                 (picnic_instance_t *)
                 CONCAT17(in_stack_fffffffffffffaaf,
                          CONCAT16(in_stack_fffffffffffffaae,in_stack_fffffffffffffaa8)));
        uVar1 = uVar10 - 2;
        if ((ptVar4->haveNodeExists[uVar1 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
          memcpy(ptVar4->nodes + uVar5 * __n,local_468,__n);
          ptVar4->haveNodeExists[uVar1 >> 6] =
               ptVar4->haveNodeExists[uVar1 >> 6] | 1L << ((ulong)uVar1 & 0x3f);
        }
        if (((uint)(ptVar4->haveNodeExists[uVar10 - 1 >> 6] >> ((byte)(uVar10 - 1) & 0x3c)) & 3) ==
            1) {
          memcpy(ptVar4->nodes + (uVar9 + 2) * __n,local_4d8,__n);
          ptVar4->haveNodeExists[uVar10 >> 6] =
               ptVar4->haveNodeExists[uVar10 >> 6] | 1L << ((byte)uVar10 & 0x3d);
        }
      }
      uVar5 = (uint)uVar7 + 1;
      uVar7 = (ulong)uVar5;
      uVar10 = uVar10 + 4;
      uVar9 = uVar9 + 2;
    } while (uVar5 <= (uint)local_518);
  }
  return;
}

Assistant:

static void expandSeeds(tree_t* tree, uint8_t* salt, unsigned int repIndex,
                        const picnic_instance_t* params) {
  const size_t seed_size = params->seed_size;

  uint8_t tmp[4 * 2 * MAX_SEED_SIZE_BYTES];
  uint8_t* tmp_ptr[4] = {&tmp[0], &tmp[2 * MAX_SEED_SIZE_BYTES], &tmp[2 * 2 * MAX_SEED_SIZE_BYTES],
                         &tmp[3 * 2 * MAX_SEED_SIZE_BYTES]};

  /* Walk the tree, expanding seeds where possible. Compute children of
   * non-leaf nodes. */
  const unsigned int lastNonLeaf = getParent(tree->numNodes - 1);
  unsigned int i                 = 0;
  /* expand the first 4 seeds*/
  for (; i <= MIN(2, lastNonLeaf); i++) {
    if (!haveNode(tree, i)) {
      continue;
    }

    hashSeed(tmp, &tree->nodes[i * seed_size], salt, HASH_PREFIX_1, repIndex, i, params);

    if (!haveNode(tree, 2 * i + 1)) {
      /* left child = H_left(seed_i || salt || t || i) */
      memcpy(&tree->nodes[(2 * i + 1) * seed_size], tmp, seed_size);
      markNode(tree, 2 * i + 1);
    }

    /* The last non-leaf node will only have a left child when there are an odd number of leaves */
    if (existsNotHaveNode(tree, 2 * i + 2)) {
      /* right child = H_right(seed_i || salt || t || i)  */
      memcpy(&tree->nodes[(2 * i + 2) * seed_size], tmp + seed_size, seed_size);
      markNode(tree, 2 * i + 2);
    }
  }
  /* now hash in groups of 4 for faster hashing */
  for (; i <= lastNonLeaf / 4 * 4; i += 4) {
    hashSeed_x4(tmp_ptr, tree, salt, HASH_PREFIX_1, repIndex, i, params);

    for (unsigned int j = i; j < i + 4; j++) {
      if (!haveNode(tree, j)) {
        continue;
      }
      if (!haveNode(tree, 2 * j + 1)) {
        /* left child = H_left(seed_i || salt || t || j) */
        memcpy(&tree->nodes[(2 * j + 1) * seed_size], tmp_ptr[j - i], seed_size);
        markNode(tree, 2 * j + 1);
      }

      /* The last non-leaf node will only have a left child when there are an odd number of leaves
       */
      if (existsNotHaveNode(tree, 2 * j + 2)) {
        /* right child = H_right(seed_i || salt || t || j)  */
        memcpy(&tree->nodes[(2 * j + 2) * seed_size], tmp_ptr[j - i] + seed_size, seed_size);
        markNode(tree, 2 * j + 2);
      }
    }
  }
  /* handle last few, which are not a multiple of 4 */
  for (; i <= lastNonLeaf; i++) {
    if (!haveNode(tree, i)) {
      continue;
    }

    hashSeed(tmp, &tree->nodes[i * seed_size], salt, HASH_PREFIX_1, repIndex, i, params);

    if (!haveNode(tree, 2 * i + 1)) {
      /* left child = H_left(seed_i || salt || t || i) */
      memcpy(&tree->nodes[(2 * i + 1) * seed_size], tmp, seed_size);
      markNode(tree, 2 * i + 1);
    }

    /* The last non-leaf node will only have a left child when there are an odd number of leaves */
    if (existsNotHaveNode(tree, 2 * i + 2)) {
      /* right child = H_right(seed_i || salt || t || i)  */
      memcpy(&tree->nodes[(2 * i + 2) * seed_size], tmp + seed_size, seed_size);
      markNode(tree, 2 * i + 2);
    }
  }
}